

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

int QMdi::MinOverlapPlacer::accumulatedOverlap(QRect *source,QList<QRect> *rects)

{
  int iVar1;
  QRect *rect;
  QRect *pQVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  pQVar2 = (rects->d).ptr;
  iVar1 = 0;
  for (lVar3 = (rects->d).size << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    auVar4 = QRect::operator&(source,pQVar2);
    iVar1 = ((auVar4._12_4_ - auVar4._4_4_) + 1) * ((auVar4._8_4_ - auVar4._0_4_) + 1) + iVar1;
    pQVar2 = pQVar2 + 1;
  }
  return iVar1;
}

Assistant:

int MinOverlapPlacer::accumulatedOverlap(const QRect &source, const QList<QRect> &rects)
{
    int accOverlap = 0;
    for (const QRect &rect : rects) {
        QRect intersection = source.intersected(rect);
        accOverlap += intersection.width() * intersection.height();
    }
    return accOverlap;
}